

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall Mesh::exportMESH(Mesh *this,string *filePath)

{
  pointer ppNVar1;
  Node *pNVar2;
  pointer ppTVar3;
  Tetrahedron *pTVar4;
  ostream *poVar5;
  pointer ppNVar6;
  pointer ppTVar7;
  ofstream file;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,(string *)filePath,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"MeshVersionFormatted 2\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"Dimension\n         3\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Vertices\n",9);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  ppNVar1 = (this->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar6 = (this->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar6 != ppNVar1; ppNVar6 = ppNVar6 + 1) {
    pNVar2 = *ppNVar6;
    poVar5 = std::ostream::_M_insert<double>((pNVar2->pos).xyz._M_elems[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
    poVar5 = std::ostream::_M_insert<double>((pNVar2->pos).xyz._M_elems[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
    poVar5 = std::ostream::_M_insert<double>((pNVar2->pos).xyz._M_elems[2]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pNVar2->label);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Tetrahedra\n",0xb);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  ppTVar3 = (this->tetrahedrons).super__Vector_base<Tetrahedron_*,_std::allocator<Tetrahedron_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar7 = (this->tetrahedrons).
                 super__Vector_base<Tetrahedron_*,_std::allocator<Tetrahedron_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar7 != ppTVar3; ppTVar7 = ppTVar7 + 1) {
    pTVar4 = *ppTVar7;
    poVar5 = (ostream *)
             std::ostream::operator<<((ostream *)&local_230,(pTVar4->nodes)._M_elems[0]->index + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pTVar4->nodes)._M_elems[1]->index + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pTVar4->nodes)._M_elems[2]->index + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pTVar4->nodes)._M_elems[3]->index + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pTVar4->label);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"End\n",4);
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Mesh::exportMESH(const std::string &filePath){
    std::ofstream file(filePath);
    file << "MeshVersionFormatted 2\n";
    file << "Dimension\n         3\n";

    file << "Vertices\n";
    file << nodes.size() << "\n";
    for(auto n:nodes){
        file << n->pos[0] 
        << "  " << n->pos[1] 
        << "  " << n->pos[2]
        << "  " << n->label <<"\n";
    }

    file << "Tetrahedra\n";
    file << tetrahedrons.size() << "\n";
    for(auto e: tetrahedrons){
        file << e->nodes[0]->index + 1
        << "  " << e->nodes[1]->index + 1
        << "  " << e->nodes[2]->index + 1
        << "  " << e->nodes[3]->index + 1
        << "  " << e->label << "\n"; 
    }

    file << "End\n";
    file.close();
}